

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::ShowInfoPane(BoardView *this)

{
  string *__rhs;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImVec2 IVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  EBoardSide EVar7;
  EBoardSide EVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar10;
  pointer psVar11;
  pointer psVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  char cVar17;
  bool bVar18;
  ImU32 col;
  EBoardSide extraout_EAX;
  EBoardSide extraout_EAX_00;
  EBoardSide EVar19;
  ImGuiIO *pIVar20;
  ImDrawList *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ImVec2 *pIVar21;
  ImVec2 *pIVar22;
  long *plVar23;
  ulong uVar24;
  ImVec2 IVar25;
  element_type *peVar26;
  ImVec2 *unaff_RBP;
  pointer psVar27;
  char cVar28;
  ulong __val;
  SharedVector<Component> *this_03;
  pointer psVar29;
  int iVar30;
  int iVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar35;
  float fVar38;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  string str;
  shared_ptr<Pin> pin;
  SharedVector<Component> *__range7;
  char bn [128];
  ImVec2 local_528;
  ImVec2 local_520;
  long local_518;
  ImVec2 IStack_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined1 local_4d8 [16];
  ImVec2 local_4c8;
  ImVec2 local_4c0;
  long local_4b8;
  ImVec2 IStack_4b0;
  float local_4a4;
  SharedVector<Component> *local_4a0;
  string local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  PDFBridgeEvince *local_458;
  pointer local_450;
  ImVec2 *local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_440;
  undefined1 local_438 [8];
  ImVec2 IStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [63];
  undefined1 auVar39 [16];
  
  pIVar20 = ImGui::GetIO();
  if ((this->config).showInfoPanel != true) {
    return;
  }
  fVar33 = (pIVar20->DisplaySize).x;
  pIVar22 = &this->m_info_surface;
  local_4d8._0_4_ = (this->m_info_surface).x;
  fVar32 = DPIF(100.0);
  if (fVar32 <= (float)local_4d8._0_4_) {
    local_438._0_4_ = fVar33 - pIVar22->x;
  }
  else {
    fVar32 = DPIF(100.0);
    (this->m_info_surface).x = fVar32 + 1.0;
    local_438._0_4_ = fVar33 - (fVar32 + 1.0);
    (this->m_board_surface).x = (float)local_438._0_4_;
  }
  (this->m_info_surface).y = (this->m_board_surface).y;
  local_438._4_4_ = this->m_menu_height;
  local_528.x = 0.0;
  local_528.y = 0.0;
  ImGui::SetNextWindowPos((ImVec2 *)local_438,0,&local_528);
  ImGui::SetNextWindowSize(pIVar22,0);
  ImGui::PushStyleVar(4,1.0);
  ImGui::Begin("Info Panel",(bool *)0x0,0x127);
  if (this->m_dragging_token == 0) {
    fVar32 = (pIVar20->MousePos).x;
    fVar1 = (this->m_board_surface).x;
    if (fVar1 < fVar32) {
      local_4d8._0_4_ = fVar32;
      local_4e8 = CONCAT44(local_4e8._4_4_,fVar1);
      fVar32 = DPIF(12.0);
      if ((float)local_4d8._0_4_ < (float)local_4e8 + fVar32) {
        this_02 = ImGui::GetWindowDrawList();
        local_528.x = (this->m_board_surface).x;
        local_4d8 = ZEXT416((uint)local_528.x);
        local_528.y = this->m_menu_height;
        fVar32 = DPIF(12.0);
        local_508._M_dataplus._M_p =
             (pointer)CONCAT44(this->m_menu_height + (this->m_board_surface).y,
                               fVar32 + (float)local_4d8._0_4_);
        local_438._0_4_ = 0.53333336;
        local_438._4_4_ = 0.53333336;
        IStack_430.x = 0.53333336;
        IStack_430.y = 0.53333336;
        col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_438);
        ImDrawList::AddRectFilled(this_02,&local_528,(ImVec2 *)&local_508,col,0.0,0);
        unaff_RBP = pIVar22;
      }
    }
  }
  bVar18 = ImGui::IsMouseDragging(0,-1.0);
  iVar30 = this->m_dragging_token;
  if (!bVar18) {
    if (iVar30 == 2) {
      iVar30 = (int)(this->m_info_surface).x;
      (this->config).infoPanelWidth = iVar30;
      Confparse::WriteInt(&this->obvconfig,"infoPanelWidth",iVar30);
    }
    this->m_dragging_token = 0;
    goto LAB_0011301c;
  }
  if (iVar30 == 0) {
    fVar32 = pIVar20->MouseClickedPos[0].x;
    fVar1 = (this->m_board_surface).x;
    if (fVar32 <= fVar1) goto LAB_0011301c;
    local_4d8._0_4_ = fVar32;
    local_4e8 = CONCAT44(local_4e8._4_4_,fVar1);
    fVar32 = DPIF(20.0);
    if ((float)local_4e8 + fVar32 <= (float)local_4d8._0_4_) {
      iVar30 = this->m_dragging_token;
      goto LAB_00112fe2;
    }
    this->m_dragging_token = 2;
  }
  else {
LAB_00112fe2:
    if (iVar30 != 2) goto LAB_0011301c;
  }
  IVar25 = ImGui::GetMouseDragDelta(0,-1.0);
  local_4d8._8_4_ = extraout_XMM0_Dc;
  local_4d8._0_4_ = IVar25.x;
  local_4d8._4_4_ = IVar25.y;
  local_4d8._12_4_ = extraout_XMM0_Dd;
  iVar30 = -(uint)(500.0 < ABS(IVar25.x));
  iVar31 = -(uint)(500.0 < ABS(IVar25.y));
  auVar15._4_4_ = iVar30;
  auVar15._0_4_ = iVar30;
  auVar15._8_4_ = iVar31;
  auVar15._12_4_ = iVar31;
  iVar30 = movmskpd((int)unaff_RBP,auVar15);
  ImGui::ResetMouseDragDelta(0);
  fVar32 = 0.0;
  if (iVar30 == 0) {
    fVar32 = (float)local_4d8._0_4_;
  }
  fVar35 = (this->m_board_surface).x + fVar32;
  (this->m_board_surface).x = fVar35;
  (this->m_info_surface).x = fVar33 - fVar35;
  fVar1 = fVar33 * 0.66;
  if (fVar35 < fVar1) {
    (this->m_board_surface).x = fVar1;
    (this->m_info_surface).x = fVar33 - fVar1;
  }
  if (0.0 < fVar32) {
    this->m_needsRedraw = true;
  }
LAB_0011301c:
  if (this->m_board == (Board *)0x0) {
    ImGui::Text("No board currently loaded.");
  }
  else {
    ImGui::Columns(2,(char *)0x0,true);
    iVar30 = (*this->m_board->_vptr_Board[4])();
    ImGui::Text("Pins: %zu",
                ((long *)CONCAT44(extraout_var,iVar30))[1] - *(long *)CONCAT44(extraout_var,iVar30)
                >> 4);
    iVar30 = (*this->m_board->_vptr_Board[3])();
    ImGui::Text("Parts: %zu",
                ((long *)CONCAT44(extraout_var_00,iVar30))[1] -
                *(long *)CONCAT44(extraout_var_00,iVar30) >> 4);
    ImGui::NextColumn();
    (*this->m_board->_vptr_Board[2])();
    ImGui::Text("Nets: %zu");
    ImGui::TextWrapped("Size: %0.2f x %0.2f\"",SUB84((double)((float)this->m_boardWidth / 1000.0),0)
                       ,SUB84((double)((float)this->m_boardHeight / 1000.0),0));
    ImGui::Columns(1,(char *)0x0,true);
    ImGui::Separator();
    bVar18 = ImGui::Checkbox("Zoom on selected net",&(this->config).infoPanelCenterZoomNets);
    if (bVar18) {
      Confparse::WriteBool
                (&this->obvconfig,"infoPanelCenterZoomNets",(this->config).infoPanelCenterZoomNets);
    }
    bVar18 = ImGui::Checkbox("Select all parts on net",&(this->config).infoPanelSelectPartsOnNet);
    if (bVar18) {
      Confparse::WriteBool
                (&this->obvconfig,"infoPanelSelectPartsOnNet",
                 (this->config).infoPanelSelectPartsOnNet);
    }
  }
  if ((this->m_partHighlighted).
      super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_partHighlighted).
      super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    ImGui::Separator();
    __val = (long)(this->m_partHighlighted).
                  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_partHighlighted).
                  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    cVar28 = '\x01';
    if (9 < __val) {
      uVar24 = __val;
      cVar17 = '\x04';
      do {
        cVar28 = cVar17;
        if (uVar24 < 100) {
          cVar28 = cVar28 + -2;
          goto LAB_0011330f;
        }
        if (uVar24 < 1000) {
          cVar28 = cVar28 + -1;
          goto LAB_0011330f;
        }
        if (uVar24 < 10000) goto LAB_0011330f;
        bVar18 = 99999 < uVar24;
        uVar24 = uVar24 / 10000;
        cVar17 = cVar28 + '\x04';
      } while (bVar18);
      cVar28 = cVar28 + '\x01';
    }
LAB_0011330f:
    local_528 = (ImVec2)&local_518;
    std::__cxx11::string::_M_construct((ulong)&local_528,cVar28);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_528,(uint)local_520.x,__val);
    pIVar21 = (ImVec2 *)std::__cxx11::string::append((char *)&local_528);
    IVar25 = (ImVec2)(pIVar21 + 2);
    if (*pIVar21 == IVar25) {
      local_428[0]._0_8_ = *(undefined8 *)IVar25;
      local_428[0]._8_8_ = pIVar21[3];
      local_438 = (undefined1  [8])local_428;
    }
    else {
      local_428[0]._0_8_ = *(undefined8 *)IVar25;
      local_438 = (undefined1  [8])*pIVar21;
    }
    IStack_430 = pIVar21[1];
    *pIVar21 = IVar25;
    pIVar21[1].x = 0.0;
    pIVar21[1].y = 0.0;
    *(undefined1 *)&pIVar21[2].x = 0;
    ImGui::TextUnformatted((char *)local_438,(char *)0x0);
    if (local_438 != (undefined1  [8])local_428) {
      operator_delete((void *)local_438,local_428[0]._M_allocated_capacity + 1);
    }
    local_448 = pIVar22;
    if (local_528 != (ImVec2)&local_518) {
      operator_delete((void *)local_528,local_518 + 1);
    }
    psVar29 = (this->m_partHighlighted).
              super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_450 = (this->m_partHighlighted).
                super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar29 != local_450) {
      local_4a0 = &this->m_partHighlighted;
      local_458 = &this->pdfBridge;
      local_440 = &(this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      do {
        peVar9 = (psVar29->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_00 = (psVar29->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                  _M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_4d8._0_8_ = psVar29;
        ImGui::Text(" ");
        bVar18 = ImGui::SmallButton((peVar9->name)._M_dataplus._M_p);
        if (bVar18) {
          if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            EVar19 = (peVar9->super_BoardElement).board_side;
            if ((EVar19 != kBoardSideBoth) && (EVar19 != this->m_current_side)) goto LAB_001134ce;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
            EVar7 = (peVar9->super_BoardElement).board_side;
            EVar8 = this->m_current_side;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            EVar19 = extraout_EAX;
            if ((EVar7 != kBoardSideBoth) && (EVar7 != EVar8)) {
LAB_001134ce:
              FlipBoard(this,0);
              EVar19 = extraout_EAX_00;
            }
          }
          fVar33 = (peVar9->centerpoint).x;
          if ((fVar33 != 0.0) || (NAN(fVar33))) {
            fVar32 = (peVar9->centerpoint).y;
            if ((fVar32 == 0.0) && (!NAN(fVar32))) goto LAB_0011357b;
            fVar1 = this->m_scale;
            IVar25 = (peVar9->outline)._M_elems[0];
            IVar4 = (peVar9->outline)._M_elems[2];
            auVar36._0_4_ = fVar1 * ABS(IVar4.x - IVar25.x);
            auVar36._4_4_ = fVar1 * ABS(IVar4.y - IVar25.y);
            auVar36._8_4_ = fVar1 * 0.0;
            auVar36._12_4_ = fVar1 * 0.0;
            IVar25 = this->m_board_surface;
            fVar35 = IVar25.x;
            fVar34 = IVar25.y;
            auVar13._8_8_ = 0;
            auVar13._0_4_ = IVar25.x;
            auVar13._4_4_ = IVar25.y;
            auVar37 = divps(auVar36,auVar13);
            fVar38 = auVar37._4_4_;
            iVar30 = -(uint)(1.0 < auVar37._0_4_);
            iVar31 = -(uint)(1.0 < fVar38);
            auVar40._4_4_ = iVar31;
            auVar40._0_4_ = iVar30;
            auVar40._8_4_ = iVar31;
            auVar40._12_4_ = iVar31;
            auVar39._8_8_ = auVar40._8_8_;
            auVar39._4_4_ = iVar30;
            auVar39._0_4_ = iVar30;
            iVar30 = movmskpd(EVar19,auVar39);
            local_4e8 = CONCAT44(fVar32,fVar33);
            if (iVar30 != 0) {
              if (auVar37._0_4_ <= fVar38) {
                auVar37._4_12_ = auVar37._4_12_;
                auVar37._0_4_ = fVar38;
              }
              this->m_scale = fVar1 / (auVar37._0_4_ * (this->config).partZoomScaleOutFactor);
            }
          }
          else {
LAB_0011357b:
            local_4e8 = *(undefined8 *)
                         (*(long *)&((peVar9->pins).
                                     super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> + 0x50);
            fVar35 = (this->m_board_surface).x;
            fVar34 = (this->m_board_surface).y;
          }
          uStack_4e0 = 0;
          IVar25 = ScreenToCoord(this,fVar35 * 0.5,fVar34 * 0.5,1.0);
          uVar2 = this->m_dx;
          uVar5 = this->m_dy;
          this->m_dx = (float)uVar2 + (IVar25.x - (float)local_4e8);
          this->m_dy = (float)uVar5 + (IVar25.y - local_4e8._4_4_);
          this->m_needsRedraw = true;
        }
        ImGui::SameLine(0.0,-1.0);
        __rhs = &peVar9->name;
        snprintf(local_438,0x80,"Z##%s",(__rhs->_M_dataplus)._M_p);
        bVar18 = ImGui::SmallButton(local_438);
        if (bVar18) {
          if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            EVar19 = (peVar9->super_BoardElement).board_side;
            if ((EVar19 != kBoardSideBoth) && (EVar19 != this->m_current_side)) goto LAB_0011366c;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
            EVar19 = (peVar9->super_BoardElement).board_side;
            EVar7 = this->m_current_side;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            if ((EVar19 != kBoardSideBoth) && (EVar19 != EVar7)) {
LAB_0011366c:
              FlipBoard(this,0);
            }
          }
          fVar33 = (peVar9->centerpoint).x;
          if ((fVar33 != 0.0) || (NAN(fVar33))) {
            fVar32 = (peVar9->centerpoint).y;
            if ((fVar32 == 0.0) && (!NAN(fVar32))) goto LAB_001136ff;
            fVar1 = this->m_scale;
            IVar25 = (peVar9->outline)._M_elems[0];
            IVar4 = (peVar9->outline)._M_elems[2];
            auVar41._0_4_ = fVar1 * ABS(IVar4.x - IVar25.x);
            auVar41._4_4_ = fVar1 * ABS(IVar4.y - IVar25.y);
            auVar41._8_4_ = fVar1 * 0.0;
            auVar41._12_4_ = fVar1 * 0.0;
            IVar25 = this->m_board_surface;
            fVar35 = IVar25.x;
            fVar34 = IVar25.y;
            auVar14._8_8_ = 0;
            auVar14._0_4_ = IVar25.x;
            auVar14._4_4_ = IVar25.y;
            auVar42 = divps(auVar41,auVar14);
            if (auVar42._0_4_ <= auVar42._4_4_) {
              auVar42._4_12_ = auVar42._4_12_;
              auVar42._0_4_ = auVar42._4_4_;
            }
            this->m_scale = fVar1 / (auVar42._0_4_ * (this->config).partZoomScaleOutFactor);
            local_4e8 = CONCAT44(fVar32,fVar33);
          }
          else {
LAB_001136ff:
            local_4e8 = *(undefined8 *)
                         (*(long *)&((peVar9->pins).
                                     super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> + 0x50);
            fVar35 = (this->m_board_surface).x;
            fVar34 = (this->m_board_surface).y;
          }
          uStack_4e0 = 0;
          IVar25 = ScreenToCoord(this,fVar35 * 0.5,fVar34 * 0.5,1.0);
          uVar3 = this->m_dx;
          uVar6 = this->m_dy;
          this->m_dx = (float)uVar3 + (IVar25.x - (float)local_4e8);
          this->m_dy = (float)uVar6 + (IVar25.y - local_4e8._4_4_);
          this->m_needsRedraw = true;
        }
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%zu Pin(s)",
                    (long)(peVar9->pins).
                          super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar9->pins).
                          super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4);
        ImGui::SameLine(0.0,-1.0);
        snprintf(local_438,0x80,"Copy##%s",(__rhs->_M_dataplus)._M_p);
        bVar18 = ImGui::SmallButton(local_438);
        if (bVar18) {
          pcVar10 = (peVar9->name)._M_dataplus._M_p;
          local_528 = (ImVec2)&local_518;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_528,pcVar10,pcVar10 + (peVar9->name)._M_string_length);
          if ((peVar9->mfgcode)._M_string_length != 0) {
            std::operator+(&local_508," ",&peVar9->mfgcode);
            std::__cxx11::string::_M_append((char *)&local_528,(ulong)local_508._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p != &local_508.field_2) {
              operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1
                             );
            }
          }
          psVar11 = (peVar9->pins).
                    super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar27 = (peVar9->pins).
                         super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; psVar27 != psVar11;
              psVar27 = psVar27 + 1) {
            std::operator+(&local_478,"\n",
                           &((psVar27->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                            ->name);
            pIVar22 = (ImVec2 *)std::__cxx11::string::append((char *)&local_478);
            local_4c8 = (ImVec2)&local_4b8;
            IVar25 = (ImVec2)(pIVar22 + 2);
            if (*pIVar22 == IVar25) {
              local_4b8 = *(long *)IVar25;
              IStack_4b0 = pIVar22[3];
            }
            else {
              local_4b8 = *(long *)IVar25;
              local_4c8 = *pIVar22;
            }
            local_4c0 = pIVar22[1];
            *pIVar22 = IVar25;
            pIVar22[1].x = 0.0;
            pIVar22[1].y = 0.0;
            *(undefined1 *)&pIVar22[2].x = 0;
            plVar23 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_4c8,
                                         (ulong)(((psVar27->
                                                  super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->net->name)._M_dataplus._M_p);
            local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
            peVar26 = (element_type *)(plVar23 + 2);
            if ((element_type *)*plVar23 == peVar26) {
              local_508.field_2._M_allocated_capacity =
                   (size_type)(peVar26->super_BoardElement)._vptr_BoardElement;
              local_508.field_2._8_8_ = plVar23[3];
            }
            else {
              local_508.field_2._M_allocated_capacity =
                   (size_type)(peVar26->super_BoardElement)._vptr_BoardElement;
              local_508._M_dataplus._M_p = (pointer)*plVar23;
            }
            local_508._M_string_length = plVar23[1];
            *plVar23 = (long)peVar26;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_528,(ulong)local_508._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p != &local_508.field_2) {
              operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4c8 != (ImVec2)&local_4b8) {
              operator_delete((void *)local_4c8,local_4b8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478._M_dataplus._M_p != &local_478.field_2) {
              operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1
                             );
            }
          }
          ImGui::SetClipboardText((char *)local_528);
          if (local_528 != (ImVec2)&local_518) {
            operator_delete((void *)local_528,local_518 + 1);
          }
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_438,"PDF Search##",__rhs);
        bVar18 = ImGui::SmallButton((char *)local_438);
        if (bVar18) {
          PDFBridgeEvince::DocumentSearch
                    (local_458,__rhs,ShowInfoPane::wholeWordsOnly,ShowInfoPane::caseSensitive);
        }
        ImGui::SameLine(0.0,-1.0);
        ImGui::Checkbox("Whole words only",&ShowInfoPane::wholeWordsOnly);
        ImGui::SameLine(0.0,-1.0);
        ImGui::Checkbox("Case sensitive",&ShowInfoPane::caseSensitive);
        if (local_438 != (undefined1  [8])local_428) {
          operator_delete((void *)local_438,local_428[0]._M_allocated_capacity + 1);
        }
        if ((peVar9->mfgcode)._M_string_length != 0) {
          ImGui::TextWrapped("%s",(peVar9->mfgcode)._M_dataplus._M_p);
        }
        ImGui::PushItemWidth(-1.0);
        local_438 = (undefined1  [8])local_428;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"##","");
        pIVar22 = (ImVec2 *)
                  std::__cxx11::string::_M_append
                            ((char *)local_438,(ulong)(peVar9->name)._M_dataplus._M_p);
        local_528 = (ImVec2)&local_518;
        IVar25 = (ImVec2)(pIVar22 + 2);
        if (*pIVar22 == IVar25) {
          local_518 = *(long *)IVar25;
          IStack_510 = pIVar22[3];
        }
        else {
          local_518 = *(long *)IVar25;
          local_528 = *pIVar22;
        }
        local_520 = pIVar22[1];
        *pIVar22 = IVar25;
        pIVar22[1].x = 0.0;
        pIVar22[1].y = 0.0;
        *(undefined1 *)&pIVar22[2].x = 0;
        if (local_438 != (undefined1  [8])local_428) {
          operator_delete((void *)local_438,local_428[0]._M_allocated_capacity + 1);
        }
        local_4c8.x = 0.0;
        local_4c8.y = 0.0;
        psVar27 = (peVar9->pins).
                  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        psVar11 = (peVar9->pins).
                  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_4e8 = CONCAT44(local_4e8._4_4_,local_448->x);
        local_4a4 = DPIF(50.0);
        fVar33 = ImGui::GetFontSize();
        iVar30 = (int)((ulong)((long)psVar27 - (long)psVar11) >> 4);
        if (0x13 < iVar30) {
          iVar30 = 0x14;
        }
        local_4c8.y = fVar33 * (float)iVar30 * 1.45;
        local_4c8.x = (float)local_4e8 - local_4a4;
        bVar18 = ImGui::BeginListBox((char *)local_528,&local_4c8);
        if (bVar18) {
          psVar11 = (peVar9->pins).
                    super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          this_03 = local_4a0;
          for (psVar27 = (peVar9->pins).
                         super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; psVar27 != psVar11;
              psVar27 = psVar27 + 1) {
            local_508._M_dataplus._M_p =
                 (pointer)(psVar27->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_508._M_string_length =
                 (size_type)
                 (psVar27->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._M_string_length)->
                _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_508._M_string_length)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._M_string_length)->
                _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_508._M_string_length)->_M_use_count + 1;
              }
            }
            snprintf(local_438,0x400,"%4s  %s",
                     (((element_type *)local_508._M_dataplus._M_p)->name)._M_dataplus._M_p,
                     (((element_type *)local_508._M_dataplus._M_p)->net->name)._M_dataplus._M_p);
            local_478._M_dataplus._M_p = (pointer)0x0;
            bVar18 = ImGui::Selectable(local_438,
                                       (element_type *)local_508._M_dataplus._M_p ==
                                       (this->m_pinSelected).
                                       super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,
                                       (ImVec2 *)&local_478);
            if (bVar18) {
              ClearAllHighlights(this);
              if ((*(uint *)(local_508._M_dataplus._M_p + 0xc) < 2) ||
                 ((*(Net **)(local_508._M_dataplus._M_p + 0x60))->is_ground == true)) {
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                push_back(this_03,(shared_ptr<Component> *)(local_508._M_dataplus._M_p + 0x68));
              }
              else {
                (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)local_508._M_dataplus._M_p;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (local_440,
                           (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_508._M_string_length
                          );
                psVar12 = (this->m_partHighlighted).
                          super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (psVar29 = (this->m_partHighlighted).
                               super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; this_03 = local_4a0,
                    psVar29 != psVar12; psVar29 = psVar29 + 1) {
                  this_01 = (psVar29->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
                            _M_refcount._M_pi;
                  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ((((shared_ptr<Component> *)(local_508._M_dataplus._M_p + 0x68))->
                     super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->visualmode
                         = '\0';
                  }
                  else {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      this_01->_M_use_count = this_01->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      this_01->_M_use_count = this_01->_M_use_count + 1;
                    }
                    ((((shared_ptr<Component> *)(local_508._M_dataplus._M_p + 0x68))->
                     super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->visualmode
                         = '\0';
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
                  }
                }
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                push_back(local_4a0,(shared_ptr<Component> *)(local_508._M_dataplus._M_p + 0x68));
                local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
                pcVar10 = ((*(Net **)(local_508._M_dataplus._M_p + 0x60))->name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_498,pcVar10,
                           pcVar10 + ((*(Net **)(local_508._M_dataplus._M_p + 0x60))->name).
                                     _M_string_length);
                CenterZoomNet(this,&local_498);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._M_dataplus._M_p != &local_498.field_2) {
                  operator_delete(local_498._M_dataplus._M_p,
                                  local_498.field_2._M_allocated_capacity + 1);
                }
              }
              this->m_needsRedraw = true;
            }
            ImGui::PushStyleColor(5,0xffeeeeee);
            ImGui::Separator();
            ImGui::PopStyleColor(1);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._M_string_length)
              ;
            }
          }
          ImGui::EndListBox();
        }
        ImGui::PopItemWidth();
        if (local_528 != (ImVec2)&local_518) {
          operator_delete((void *)local_528,local_518 + 1);
        }
        uVar16 = local_4d8._0_8_;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        psVar29 = (pointer)(uVar16 + 0x10);
      } while (psVar29 != local_450);
    }
    ImGui::Text(" ");
    ImGui::Separator();
    ImGui::Separator();
    ImGui::Separator();
  }
  ImGui::End();
  ImGui::PopStyleVar(1);
  return;
}

Assistant:

void BoardView::ShowInfoPane(void) {
	ImGuiIO &io = ImGui::GetIO();
	ImVec2 ds   = io.DisplaySize;

	if (!config.showInfoPanel) return;

	if (m_info_surface.x < DPIF(100)) {
		//	fprintf(stderr,"Too small (%f), set to (%f)\n", width, DPIF(100));
		m_info_surface.x  = DPIF(100) + 1;
		m_board_surface.x = ds.x - m_info_surface.x;
	}

	m_info_surface.y = m_board_surface.y;

	/*
	 * Originally the dialog was to follow the cursor but it proved to be an overkill
	 * to try adjust things to keep it within the bounds of the window so as to not
	 * lose the buttons.
	 *
	 * Now it's kept at a fixed point.
	 */
	ImGui::SetNextWindowPos(ImVec2(ds.x - m_info_surface.x, m_menu_height));
	ImGui::SetNextWindowSize(m_info_surface);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::Begin("Info Panel",
	             NULL,
	             ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoResize |
	                 ImGuiWindowFlags_NoSavedSettings);

	if ((m_dragging_token == 0) && (io.MousePos.x > m_board_surface.x) && (io.MousePos.x < (m_board_surface.x + DPIF(12.0f)))) {
		ImDrawList *draw = ImGui::GetWindowDrawList();
		draw->AddRectFilled(ImVec2(m_board_surface.x, m_menu_height),
		                    ImVec2(m_board_surface.x + DPIF(12.0f), m_board_surface.y + m_menu_height),
		                    ImColor(0x88888888));
		//			DrawHex( draw, io.MousePos, DPIF(10.0f), ImColor(0xFF0000FF) );
	}

	if (ImGui::IsMouseDragging(0)) {
		if ((m_dragging_token == 0) && (io.MouseClickedPos[0].x > m_board_surface.x) &&
		    (io.MouseClickedPos[0].x < (m_board_surface.x + DPIF(20.0f))))
			m_dragging_token = 2; // own it.
		if (m_dragging_token == 2) {
			ImVec2 delta = ImGui::GetMouseDragDelta();
			if ((abs(delta.x) > 500) || (abs(delta.y) > 500)) {
				delta.x = 0;
				delta.y = 0;
			} // If the delta values are crazy just drop them (happens when panning
			// off screen). 500 arbritary chosen
			ImGui::ResetMouseDragDelta();
			m_board_surface.x += delta.x;
			m_info_surface.x = ds.x - m_board_surface.x;
			if (m_board_surface.x < ds.x * 0.66) {
				m_board_surface.x = ds.x * 0.66;
				m_info_surface.x  = ds.x - m_board_surface.x;
			}
			if (delta.x > 0) m_needsRedraw = true;
		}
	} else {
		if (m_dragging_token == 2) {
			config.infoPanelWidth = m_info_surface.x;
			obvconfig.WriteInt("infoPanelWidth", m_info_surface.x);
		}
		m_dragging_token = 0;
	}

	if (m_board) {
		ImGui::Columns(2);
		ImGui::Text("Pins: %zu", m_board->Pins().size());
		ImGui::Text("Parts: %zu", m_board->Components().size());
		ImGui::NextColumn();
		ImGui::Text("Nets: %zu", m_board->Nets().size());
		ImGui::TextWrapped("Size: %0.2f x %0.2f\"", m_boardWidth / 1000.0f, m_boardHeight / 1000.0f);
		ImGui::Columns(1);
		ImGui::Separator();
		if (ImGui::Checkbox("Zoom on selected net", &config.infoPanelCenterZoomNets)) {
			obvconfig.WriteBool("infoPanelCenterZoomNets", config.infoPanelCenterZoomNets);
		}
		if (ImGui::Checkbox("Select all parts on net", &config.infoPanelSelectPartsOnNet)) {
			obvconfig.WriteBool("infoPanelSelectPartsOnNet", config.infoPanelSelectPartsOnNet);
		}
	} else {
		ImGui::Text("No board currently loaded.");
	}

	if (m_partHighlighted.size()) {
		ImGui::Separator();
		ImGui::TextUnformatted((std::to_string(m_partHighlighted.size()) + " parts selected").c_str());

		for (auto part : m_partHighlighted) {

			ImGui::Text(" ");

			if (ImGui::SmallButton(part->name.c_str())) {
				if (!BoardElementIsVisible(part)) FlipBoard();
				if (part->centerpoint.x && part->centerpoint.y) {
					ImVec2 psz;

					/*
					 * Check to see if we need to zoom BACK a bit to fit the part in to view
					 */
					psz = ImVec2(abs(part->outline[2].x - part->outline[0].x) * m_scale / m_board_surface.x,
					             abs(part->outline[2].y - part->outline[0].y) * m_scale / m_board_surface.y);
					if ((psz.x > 1) || (psz.y > 1)) {
						if (psz.x > psz.y) {
							m_scale /= (config.partZoomScaleOutFactor * psz.x);
						} else {
							m_scale /= (config.partZoomScaleOutFactor * psz.y);
						}
					}

					SetTarget(part->centerpoint.x, part->centerpoint.y);
				} else {
					SetTarget(part->pins[0]->position.x, part->pins[0]->position.y);
				}
				m_needsRedraw = 1;
			}
			ImGui::SameLine();
			{
				char bn[128];
				snprintf(bn, sizeof(bn), "Z##%s", part->name.c_str());
				if (ImGui::SmallButton(bn)) {
					if (!BoardElementIsVisible(part)) FlipBoard();
					if (part->centerpoint.x && part->centerpoint.y) {
						ImVec2 psz;

						/*
						 * Check to see if we need to zoom BACK a bit to fit the part in to view
						 */
						psz = ImVec2(abs(part->outline[2].x - part->outline[0].x) * m_scale / m_board_surface.x,
						             abs(part->outline[2].y - part->outline[0].y) * m_scale / m_board_surface.y);
						if (psz.x > psz.y) {
							m_scale /= (config.partZoomScaleOutFactor * psz.x);
						} else {
							m_scale /= (config.partZoomScaleOutFactor * psz.y);
						}

						SetTarget(part->centerpoint.x, part->centerpoint.y);
					} else {
						SetTarget(part->pins[0]->position.x, part->pins[0]->position.y);
					}
					m_needsRedraw = 1;
				}
			}

			ImGui::SameLine();
			ImGui::Text("%zu Pin(s)", part->pins.size());
			ImGui::SameLine();
			{
				char name_and_id[128];
				snprintf(name_and_id, sizeof(name_and_id), "Copy##%s", part->name.c_str());
				if (ImGui::SmallButton(name_and_id)) {
					// std::string speed is no concern here, since button action is not in UI rendering loop
					std::string to_copy = part->name;
					if (part->mfgcode.size()) {
						to_copy += " " + part->mfgcode;
					}
					for (const auto &pin : part->pins) {
						to_copy += "\n" + pin->name + " " + pin->net->name;
					}
					ImGui::SetClipboardText(to_copy.c_str());
				}
			}

			{
				static bool wholeWordsOnly = true;
				static bool caseSensitive = false;
				std::string pdfButtonName = "PDF Search##" + part->name;
				if (ImGui::SmallButton(pdfButtonName.c_str())) {
					pdfBridge.DocumentSearch(part->name, wholeWordsOnly, caseSensitive);
				}
				ImGui::SameLine();
				ImGui::Checkbox("Whole words only", &wholeWordsOnly);
				ImGui::SameLine();
				ImGui::Checkbox("Case sensitive", &caseSensitive);
			}

			if (part->mfgcode.size()) ImGui::TextWrapped("%s", part->mfgcode.c_str());

			/*
			 * Generate the pin# and net table
			 */
			ImGui::PushItemWidth(-1);
			std::string str = std::string("##") + part->name;
			ImVec2 listSize;
			int pc = part->pins.size();
			if (pc > 20) pc = 20;
			listSize = ImVec2(m_info_surface.x - DPIF(50), pc * ImGui::GetFontSize() * 1.45);
			if (ImGui::BeginListBox(str.c_str(), listSize)) { //, ImVec2(m_board_surface.x/3 -5, m_board_surface.y/2));
				for (auto pin : part->pins) {
					char ss[1024];
					snprintf(ss, sizeof(ss), "%4s  %s", pin->name.c_str(), pin->net->name.c_str());
					if (ImGui::Selectable(ss, (pin == m_pinSelected))) {
						ClearAllHighlights();

						if ((pin->type == Pin::kPinTypeNotConnected) || (pin->type == Pin::kPinTypeUnkown) || (pin->net->is_ground)) {
							m_partHighlighted.push_back(pin->component);
							// do nothing for now
							//
						} else {
							m_pinSelected = pin;
							for (auto p : m_partHighlighted) {
								pin->component->visualmode = pin->component->CVMNormal;
							};
							m_partHighlighted.push_back(pin->component);
							CenterZoomNet(pin->net->name);
						}
						m_needsRedraw = true;
					}
					ImGui::PushStyleColor(ImGuiCol_Border, 0xffeeeeee);
					ImGui::Separator();
					ImGui::PopStyleColor();
				}
				ImGui::EndListBox();
			}
			ImGui::PopItemWidth();

		} // for each part in the list
		ImGui::Text(" ");
		ImGui::Separator();
		ImGui::Separator();
		ImGui::Separator();
	}

	ImGui::End();
	ImGui::PopStyleVar();
}